

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cc
# Opt level: O0

void sptk::world::anon_unknown_1::D4CLoveTrain
               (double *x,int fs,int x_length,double *f0,int f0_length,double *temporal_positions,
               double *aperiodicity0,RandnState *randn_state)

{
  int iVar1;
  long in_RCX;
  undefined4 in_EDX;
  undefined8 unaff_RBX;
  int in_ESI;
  double in_RDI;
  int in_R8D;
  double dVar2;
  double *unaff_retaddr;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  ForwardRealFFT *in_stack_00000020;
  RandnState *in_stack_00000028;
  int i;
  int boundary2;
  int boundary1;
  int boundary0;
  ForwardRealFFT forward_real_fft;
  int fft_size;
  double lowest_f0;
  int local_b0;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 local_a0 [4];
  int in_stack_ffffffffffffff64;
  ForwardRealFFT *in_stack_ffffffffffffffb0;
  
  dVar2 = log(((double)in_ESI * 3.0) / 40.0 + 1.0);
  dVar2 = pow(2.0,(double)(int)(dVar2 / 0.6931471805599453) + 1.0);
  iVar1 = (int)dVar2;
  memset(local_a0,0,0x60);
  InitializeForwardRealFFT
            (in_stack_ffffffffffffff64,
             (ForwardRealFFT *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  ceil(((double)iVar1 * 100.0) / (double)in_ESI);
  ceil(((double)iVar1 * 4000.0) / (double)in_ESI);
  ceil(((double)iVar1 * 7900.0) / (double)in_ESI);
  for (local_b0 = 0; local_b0 < in_R8D; local_b0 = local_b0 + 1) {
    dVar2 = *(double *)(in_RCX + (long)local_b0 * 8);
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      MyMaxDouble(*(double *)(in_RCX + (long)local_b0 * 8),40.0);
      dVar2 = D4CLoveTrainSub(unaff_retaddr,(int)((ulong)unaff_RBX >> 0x20),(int)unaff_RBX,in_RDI,
                              (double)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),
                              (int)in_RCX,in_R8D,in_stack_00000010,in_stack_00000018,
                              in_stack_00000020,in_stack_00000028);
      *(double *)(in_stack_00000008 + (long)local_b0 * 8) = dVar2;
    }
    else {
      *(undefined8 *)(in_stack_00000008 + (long)local_b0 * 8) = 0;
    }
  }
  DestroyForwardRealFFT(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

static void D4CLoveTrain(const double *x, int fs, int x_length,
    const double *f0, int f0_length, const double *temporal_positions,
    double *aperiodicity0, RandnState *randn_state) {
  double lowest_f0 = 40.0;
  int fft_size = static_cast<int>(pow(2.0, 1.0 +
    static_cast<int>(log(3.0 * fs / lowest_f0 + 1) / world::kLog2)));
  ForwardRealFFT forward_real_fft = { 0 };
  InitializeForwardRealFFT(fft_size, &forward_real_fft);

  // Cumulative powers at 100, 4000, 7900 Hz are used for VUV identification.
  int boundary0 = static_cast<int>(ceil(100.0 * fft_size / fs));
  int boundary1 = static_cast<int>(ceil(4000.0 * fft_size / fs));
  int boundary2 = static_cast<int>(ceil(7900.0 * fft_size / fs));
  for (int i = 0; i < f0_length; ++i) {
    if (f0[i] == 0.0) {
      aperiodicity0[i] = 0.0;
      continue;
    }
    aperiodicity0[i] = D4CLoveTrainSub(x, fs, x_length,
        MyMaxDouble(f0[i], lowest_f0), temporal_positions[i], f0_length,
        fft_size, boundary0, boundary1, boundary2, &forward_real_fft,
        randn_state);
  }

  DestroyForwardRealFFT(&forward_real_fft);
}